

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O1

void __thiscall DSectorEffect::Destroy(DSectorEffect *this)

{
  sector_t_conflict *psVar1;
  DThinker *pDVar2;
  DSectorEffect *pDVar3;
  
  psVar1 = this->m_Sector;
  if (psVar1 != (sector_t_conflict *)0x0) {
    pDVar3 = (psVar1->floordata).field_0.p;
    if ((pDVar3 != (DSectorEffect *)0x0) &&
       (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (psVar1->floordata).field_0.p = (DSectorEffect *)0x0;
      pDVar3 = (DSectorEffect *)0x0;
    }
    if (pDVar3 == this) {
      (this->m_Sector->floordata).field_0.p = (DSectorEffect *)0x0;
    }
    pDVar3 = (this->m_Sector->ceilingdata).field_0.p;
    if ((pDVar3 != (DSectorEffect *)0x0) &&
       (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->m_Sector->ceilingdata).field_0.p = (DSectorEffect *)0x0;
      pDVar3 = (DSectorEffect *)0x0;
    }
    if (pDVar3 == this) {
      (this->m_Sector->ceilingdata).field_0.p = (DSectorEffect *)0x0;
    }
    pDVar3 = (this->m_Sector->lightingdata).field_0.p;
    if ((pDVar3 != (DSectorEffect *)0x0) &&
       (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->m_Sector->lightingdata).field_0.p = (DSectorEffect *)0x0;
      pDVar3 = (DSectorEffect *)0x0;
    }
    if (pDVar3 == this) {
      (this->m_Sector->lightingdata).field_0.p = (DSectorEffect *)0x0;
      DThinker::Destroy(&this->super_DThinker);
      return;
    }
  }
  pDVar2 = (this->super_DThinker).NextThinker;
  if (((this->super_DThinker).PrevThinker == (DThinker *)0x0) != (pDVar2 != (DThinker *)0x0)) {
    if (pDVar2 != (DThinker *)0x0) {
      DThinker::Remove(&this->super_DThinker);
    }
    DObject::Destroy((DObject *)this);
    return;
  }
  __assert_fail("(NextThinker != NULL && PrevThinker != NULL) || (NextThinker == NULL && PrevThinker == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,0x103,"virtual void DThinker::Destroy()");
}

Assistant:

void DSectorEffect::Destroy()
{
	if (m_Sector)
	{
		if (m_Sector->floordata == this)
		{
			m_Sector->floordata = NULL;
		}
		if (m_Sector->ceilingdata == this)
		{
			m_Sector->ceilingdata = NULL;
		}
		if (m_Sector->lightingdata == this)
		{
			m_Sector->lightingdata = NULL;
		}
	}
	Super::Destroy();
}